

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_14::FieldValuePrinterWrapper::PrintFieldName
          (FieldValuePrinterWrapper *this,Message *message,Reflection *reflection,
          FieldDescriptor *field,BaseTextGenerator *generator)

{
  pointer pFVar1;
  string local_60 [32];
  string_view local_40;
  BaseTextGenerator *local_30;
  BaseTextGenerator *generator_local;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  FieldValuePrinterWrapper *this_local;
  
  local_30 = generator;
  generator_local = (BaseTextGenerator *)field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  message_local = (Message *)this;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->(&this->delegate_);
  (*pFVar1->_vptr_FieldValuePrinter[0xc])
            (local_60,pFVar1,reflection_local,field_local,generator_local);
  local_40 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_60);
  TextFormat::BaseTextGenerator::PrintString(generator,local_40);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void PrintFieldName(const Message& message, const Reflection* reflection,
                      const FieldDescriptor* field,
                      TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(
        delegate_->PrintFieldName(message, reflection, field));
  }